

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

void __thiscall
ImStb::stb_textedit_find_charpos
          (ImStb *this,StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  ImWchar *pIVar1;
  ushort uVar2;
  ImFont *pIVar3;
  int iVar4;
  float *pfVar5;
  float fVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  ImVec2 IVar12;
  ImWchar *text_remaining;
  ImWchar *local_40;
  int local_34;
  
  fVar11 = find->y;
  fVar6 = SUB84(str,0);
  if (fVar11 == fVar6) {
    if (n == 0) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0x3f800000;
      iVar8 = 0;
      iVar4 = 0;
      if ((int)fVar11 < 1) {
        iVar9 = 0;
      }
      else {
        do {
          iVar9 = iVar4;
          local_40 = (ImWchar *)0x0;
          pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)iVar9 * 2);
          InputTextCalcTextSizeW
                    (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 2),&local_40,
                     (ImVec2 *)0x1,SUB41(single_line,0));
          iVar8 = iVar9 + (int)((ulong)((long)local_40 - (long)pIVar1) >> 1);
          iVar4 = iVar8;
        } while (iVar8 < (int)fVar11);
      }
      *(int *)(this + 0xc) = iVar8;
      *(undefined4 *)(this + 0x10) = 0;
      *(int *)(this + 0x14) = iVar9;
    }
    else {
      local_40 = (ImWchar *)0x0;
      IVar12 = InputTextCalcTextSizeW
                         (*(ImWchar **)(find + 1),*(ImWchar **)(find + 1) + (int)fVar11,&local_40,
                          (ImVec2 *)0x1,SUB41(single_line,0));
      *(undefined4 *)(this + 4) = 0;
      *(undefined4 *)(this + 0xc) = 0;
      *(float *)(this + 0x10) = fVar11;
      *(float *)(this + 8) = IVar12.y;
      *(float *)this = IVar12.x;
    }
  }
  else {
    fVar11 = 0.0;
    local_34 = 0;
    iVar4 = 0;
    while( true ) {
      iVar9 = iVar4;
      *(float *)(this + 4) = fVar11;
      local_40 = (ImWchar *)0x0;
      lVar7 = (long)iVar9;
      pIVar1 = (ImWchar *)(*(long *)(find + 1) + lVar7 * 2);
      IVar12 = InputTextCalcTextSizeW
                         (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 2),&local_40
                          ,(ImVec2 *)0x1,SUB41(single_line,0));
      iVar8 = (int)((ulong)((long)local_40 - (long)pIVar1) >> 1);
      iVar4 = iVar9 + iVar8;
      if ((int)fVar6 < iVar4) break;
      fVar11 = IVar12.y + *(float *)(this + 4);
      local_34 = iVar9;
    }
    *(int *)(this + 0xc) = iVar9;
    *(int *)(this + 0x10) = iVar8;
    *(float *)(this + 8) = IVar12.y;
    *(int *)(this + 0x14) = local_34;
    *(undefined4 *)this = 0;
    uVar10 = (ulong)(uint)((int)fVar6 - iVar9);
    if ((int)fVar6 - iVar9 != 0 && iVar9 <= (int)fVar6) {
      do {
        uVar2 = *(ushort *)(*(long *)(find + 1) + lVar7 * 2);
        fVar11 = -1.0;
        if (uVar2 != 10) {
          pIVar3 = GImGui->Font;
          pfVar5 = &pIVar3->FallbackAdvanceX;
          if ((int)(uint)uVar2 < (pIVar3->IndexAdvanceX).Size) {
            pfVar5 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar3->IndexAdvanceX).Data);
          }
          fVar11 = (GImGui->FontSize / pIVar3->FontSize) * *pfVar5;
        }
        *(float *)this = fVar11 + *(float *)this;
        lVar7 = lVar7 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}